

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_result ma_context_enumerate_devices__null
                    (ma_context *pContext,ma_enum_devices_callback_proc callback,void *pUserData)

{
  ma_bool32 mVar1;
  size_t i;
  long lVar2;
  ma_device_info_conflict deviceInfo;
  ma_device_info_conflict mStack_628;
  
  if (pContext == (ma_context *)0x0) {
    __assert_fail("pContext != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                  ,0x1da7,
                  "ma_result ma_context_enumerate_devices__null(ma_context *, ma_enum_devices_callback_proc, void *)"
                 );
  }
  if (callback != (ma_enum_devices_callback_proc)0x0) {
    lVar2 = 0;
    memset(&mStack_628,0,0x608);
    do {
      mStack_628.name[lVar2] = "NULL Playback Device"[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x14);
    mStack_628.name[0x14] = '\0';
    mStack_628.isDefault = 1;
    mVar1 = (*callback)(pContext,ma_device_type_playback,&mStack_628,pUserData);
    if (mVar1 != 0) {
      lVar2 = 0;
      memset(&mStack_628,0,0x608);
      do {
        mStack_628.name[lVar2] = "NULL Capture Device"[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x13);
      mStack_628.name[0x13] = '\0';
      mStack_628.isDefault = 1;
      (*callback)(pContext,ma_device_type_capture,&mStack_628,pUserData);
    }
    return MA_SUCCESS;
  }
  __assert_fail("callback != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                ,0x1da8,
                "ma_result ma_context_enumerate_devices__null(ma_context *, ma_enum_devices_callback_proc, void *)"
               );
}

Assistant:

static ma_result ma_context_enumerate_devices__null(ma_context* pContext, ma_enum_devices_callback_proc callback, void* pUserData)
{
    ma_bool32 cbResult = MA_TRUE;

    MA_ASSERT(pContext != NULL);
    MA_ASSERT(callback != NULL);

    /* Playback. */
    if (cbResult) {
        ma_device_info deviceInfo;
        MA_ZERO_OBJECT(&deviceInfo);
        ma_strncpy_s(deviceInfo.name, sizeof(deviceInfo.name), "NULL Playback Device", (size_t)-1);
        deviceInfo.isDefault = MA_TRUE; /* Only one playback and capture device for the null backend, so might as well mark as default. */
        cbResult = callback(pContext, ma_device_type_playback, &deviceInfo, pUserData);
    }

    /* Capture. */
    if (cbResult) {
        ma_device_info deviceInfo;
        MA_ZERO_OBJECT(&deviceInfo);
        ma_strncpy_s(deviceInfo.name, sizeof(deviceInfo.name), "NULL Capture Device", (size_t)-1);
        deviceInfo.isDefault = MA_TRUE; /* Only one playback and capture device for the null backend, so might as well mark as default. */
        cbResult = callback(pContext, ma_device_type_capture, &deviceInfo, pUserData);
    }

    (void)cbResult; /* Silence a static analysis warning. */

    return MA_SUCCESS;
}